

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void luaV_objlen(lua_State *L,StkId ra,TValue *rb)

{
  Table *t;
  Table *events;
  byte bVar1;
  TValue *f;
  ulong uVar2;
  TValue *io;
  
  bVar1 = rb->tt_ & 0x3f;
  if (bVar1 == 4) {
    uVar2 = (ulong)(byte)(rb->value_).f[0xb];
  }
  else {
    if (bVar1 != 0x14) {
      if (bVar1 == 5) {
        t = (Table *)(rb->value_).gc;
        events = t->metatable;
        if ((events == (Table *)0x0) || ((events->flags & 0x10) != 0)) {
          f = (TValue *)0x0;
        }
        else {
          f = luaT_gettm(events,TM_LEN,L->l_G->tmname[4]);
        }
        if (f == (TValue *)0x0) {
          uVar2 = luaH_getn(t);
          goto LAB_0015327d;
        }
      }
      else {
        f = luaT_gettmbyobj(L,rb,TM_LEN);
        if ((f->tt_ & 0xf) == 0) {
          luaG_typeerror(L,rb,"get length of");
        }
      }
      luaT_callTMres(L,f,rb,rb,ra);
      return;
    }
    uVar2 = *(ulong *)((rb->value_).f + 0x10);
  }
LAB_0015327d:
  (ra->val).value_.i = uVar2;
  (ra->val).tt_ = '\x03';
  return;
}

Assistant:

void luaV_objlen (lua_State *L, StkId ra, const TValue *rb) {
  const TValue *tm;
  switch (ttypetag(rb)) {
    case LUA_VTABLE: {
      Table *h = hvalue(rb);
      tm = fasttm(L, h->metatable, TM_LEN);
      if (tm) break;  /* metamethod? break switch to call it */
      setivalue(s2v(ra), luaH_getn(h));  /* else primitive len */
      return;
    }
    case LUA_VSHRSTR: {
      setivalue(s2v(ra), tsvalue(rb)->shrlen);
      return;
    }
    case LUA_VLNGSTR: {
      setivalue(s2v(ra), tsvalue(rb)->u.lnglen);
      return;
    }
    default: {  /* try metamethod */
      tm = luaT_gettmbyobj(L, rb, TM_LEN);
      if (l_unlikely(notm(tm)))  /* no metamethod? */
        luaG_typeerror(L, rb, "get length of");
      break;
    }
  }
  luaT_callTMres(L, tm, rb, rb, ra);
}